

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONWorkflowPresets.cxx
# Opt level: O1

bool cmCMakePresetsGraphInternal::WorkflowPresetsHelper
               (vector<cmCMakePresetsGraph::WorkflowPreset,_std::allocator<cmCMakePresetsGraph::WorkflowPreset>_>
                *out,Value *value,cmJSONState *state)

{
  bool bVar1;
  int iVar2;
  Object<cmCMakePresetsGraph::WorkflowPreset> *in_RCX;
  code *local_98;
  undefined8 uStack_90;
  code *local_88;
  code *pcStack_80;
  cmJSONState *local_70;
  Value *local_68;
  Object<cmCMakePresetsGraph::WorkflowPreset> local_60;
  
  if (WorkflowPresetsHelper(std::vector<cmCMakePresetsGraph::WorkflowPreset,std::allocator<cmCMakePresetsGraph::WorkflowPreset>>&,Json::Value_const*,cmJSONState*)
      ::helper == '\0') {
    iVar2 = __cxa_guard_acquire(&WorkflowPresetsHelper(std::vector<cmCMakePresetsGraph::WorkflowPreset,std::allocator<cmCMakePresetsGraph::WorkflowPreset>>&,Json::Value_const*,cmJSONState*)
                                 ::helper);
    if (iVar2 != 0) {
      uStack_90 = 0;
      local_98 = cmCMakePresetsErrors::INVALID_PRESETS;
      pcStack_80 = std::
                   _Function_handler<void_(const_Json::Value_*,_cmJSONState_*),_void_(*)(const_Json::Value_*,_cmJSONState_*)>
                   ::_M_invoke;
      local_88 = std::
                 _Function_handler<void_(const_Json::Value_*,_cmJSONState_*),_void_(*)(const_Json::Value_*,_cmJSONState_*)>
                 ::_M_manager;
      cmJSONHelperBuilder::Object<cmCMakePresetsGraph::WorkflowPreset>::Object
                (&local_60,
                 (Object<cmCMakePresetsGraph::WorkflowPreset> *)
                 (anonymous_namespace)::WorkflowPresetHelper);
      cmJSONHelperBuilder::
      Vector<cmCMakePresetsGraph::WorkflowPreset,cmJSONHelperBuilder::Object<cmCMakePresetsGraph::WorkflowPreset>>
                (&WorkflowPresetsHelper::helper,(cmJSONHelperBuilder *)&local_98,
                 (ErrorGenerator *)&local_60,in_RCX);
      cmJSONHelperBuilder::Object<cmCMakePresetsGraph::WorkflowPreset>::~Object(&local_60);
      if (local_88 != (code *)0x0) {
        (*local_88)(&local_98,&local_98,3);
      }
      __cxa_atexit(std::_Function_base::~_Function_base,&WorkflowPresetsHelper::helper,&__dso_handle
                  );
      __cxa_guard_release(&WorkflowPresetsHelper(std::vector<cmCMakePresetsGraph::WorkflowPreset,std::allocator<cmCMakePresetsGraph::WorkflowPreset>>&,Json::Value_const*,cmJSONState*)
                           ::helper);
    }
  }
  local_70 = state;
  local_68 = value;
  if (WorkflowPresetsHelper::helper.super__Function_base._M_manager != (_Manager_type)0x0) {
    bVar1 = (*WorkflowPresetsHelper::helper._M_invoker)
                      ((_Any_data *)&WorkflowPresetsHelper::helper,out,&local_68,&local_70);
    return bVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

bool WorkflowPresetsHelper(
  std::vector<cmCMakePresetsGraph::WorkflowPreset>& out,
  const Json::Value* value, cmJSONState* state)
{
  static auto const helper = cmJSONHelperBuilder::Vector<WorkflowPreset>(
    cmCMakePresetsErrors::INVALID_PRESETS, WorkflowPresetHelper);

  return helper(out, value, state);
}